

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringBuilder.h
# Opt level: O0

void __thiscall
Js::StringBuilder<Memory::ArenaAllocator>::StringBuilder
          (StringBuilder<Memory::ArenaAllocator> *this,ArenaAllocator *alloc,charcount_t initialSize
          )

{
  charcount_t initialSize_local;
  ArenaAllocator *alloc_local;
  StringBuilder<Memory::ArenaAllocator> *this_local;
  
  this->alloc = alloc;
  this->firstChunk = (Data *)0x0;
  this->secondChunk = (Data *)0x0;
  this->appendPtr = (char16 *)0x0;
  this->length = 0;
  this->count = 0;
  this->initialSize = initialSize;
  if (0x7ffffffe < initialSize) {
    Throw::OutOfMemory();
  }
  return;
}

Assistant:

StringBuilder(TAllocator* alloc, charcount_t initialSize) : alloc(alloc), length(0), count(0), firstChunk(NULL),
            secondChunk(NULL), appendPtr(NULL), initialSize(initialSize)
        {
            if (initialSize > MaxLength)
            {
                Throw::OutOfMemory();
            }
        }